

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::ReadArrayElement
          (JSONStringifier *this,uint32 index,RecyclableObject *arr,JSONProperty *prop,
          JSONObjectStack *objectStack)

{
  int iVar1;
  JavascriptArray *pJVar2;
  undefined4 extraout_var;
  JavascriptString *key;
  JavascriptString *indexString;
  JavascriptArray *jsArray;
  Var value;
  JSONObjectStack *objectStack_local;
  JSONProperty *prop_local;
  RecyclableObject *arr_local;
  JSONStringifier *pJStack_10;
  uint32 index_local;
  JSONStringifier *this_local;
  
  jsArray = (JavascriptArray *)0x0;
  value = objectStack;
  objectStack_local = (JSONObjectStack *)prop;
  prop_local = (JSONProperty *)arr;
  arr_local._4_4_ = index;
  pJStack_10 = this;
  pJVar2 = Js::JavascriptArray::TryVarToNonES5Array(arr);
  if (pJVar2 != (JavascriptArray *)0x0) {
    iVar1 = (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])();
    if (iVar1 == 0) {
      iVar1 = (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar2,(ulong)arr_local._4_4_);
      jsArray = (JavascriptArray *)CONCAT44(extraout_var,iVar1);
      goto LAB_010ba95e;
    }
  }
  Js::JavascriptOperators::GetItem
            ((RecyclableObject *)prop_local,arr_local._4_4_,&jsArray,this->scriptContext);
LAB_010ba95e:
  key = ScriptContext::GetIntegerString(this->scriptContext,arr_local._4_4_);
  ReadProperty(this,key,(RecyclableObject *)prop_local,(JSONProperty *)objectStack_local,jsArray,
               (JSONObjectStack *)value);
  return;
}

Assistant:

void
JSONStringifier::ReadArrayElement(uint32 index, _In_ RecyclableObject* arr, _Out_ JSONProperty* prop, _In_ JSONObjectStack* objectStack)
{
    Var value = nullptr;
    JavascriptArray* jsArray = JavascriptArray::TryVarToNonES5Array(arr);
    if (jsArray && !jsArray->IsCrossSiteObject())
    {
        value = jsArray->DirectGetItem(index);
    }
    else
    {
        JavascriptOperators::GetItem(arr, index, &value, this->scriptContext);
    }
    JavascriptString* indexString = this->scriptContext->GetIntegerString(index);
    this->ReadProperty(indexString, arr, prop, value, objectStack);
}